

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::DestroyProtos(RepeatedPtrFieldBase *this)

{
  bool bVar1;
  int iVar2;
  LogMessage *pLVar3;
  void **ppvVar4;
  Rep *p;
  RepeatedPtrFieldBase *this_local;
  int i;
  void **elems;
  int n;
  char *local_30;
  LogMessageFatal local_28 [23];
  Voidify local_11;
  RepeatedPtrFieldBase *local_10;
  
  local_10 = this;
  bVar1 = NeedsDestroy(this);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&n,"NeedsDestroy()");
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/repeated_ptr_field.h"
               ,0xdd,_n,local_30);
    pLVar3 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_28);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_11,pLVar3);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_28);
  }
  if (this->arena_ == (Arena *)0x0) {
    iVar2 = allocated_size(this);
    ppvVar4 = elements(this);
    for (this_local._4_4_ = 0; this_local._4_4_ < iVar2; this_local._4_4_ = this_local._4_4_ + 1) {
      Delete<google::protobuf::internal::GenericTypeHandler<google::protobuf::MessageLite>>
                (ppvVar4[this_local._4_4_],(Arena *)0x0);
    }
    bVar1 = using_sso(this);
    if (!bVar1) {
      p = rep(this);
      iVar2 = Capacity(this);
      SizedDelete(p,(long)iVar2 * 8 + 8);
    }
  }
  this->tagged_rep_or_elem_ = (void *)0x0;
  return;
}

Assistant:

void RepeatedPtrFieldBase::DestroyProtos() {
  PROTOBUF_ALWAYS_INLINE_CALL Destroy<GenericTypeHandler<MessageLite>>();

  // TODO:  Eliminate this store when invoked from the destructor,
  // since it is dead.
  tagged_rep_or_elem_ = nullptr;
}